

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O3

int testNumberOfNeighborsWithDefaultValueInSet(void)

{
  bool bVar1;
  TypeUnion TVar2;
  Int64Parameter *this;
  Int64Set *pIVar3;
  UniformWeighting *this_00;
  NearestNeighborsIndex *this_01;
  SquaredEuclideanDistance *this_02;
  SingleKdTreeIndex *this_03;
  ostream *poVar4;
  int iVar5;
  Result res;
  Model m1;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  CoreML::KNNValidatorTests::generateInterface(&local_50);
  if (local_50._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 0x194;
    TVar2.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x48);
    CoreML::Specification::KNearestNeighborsClassifier::KNearestNeighborsClassifier
              (TVar2.knearestneighborsclassifier_);
    local_50.Type_.pipelineclassifier_ = TVar2.pipelineclassifier_;
  }
  TVar2 = local_50.Type_;
  this = (local_50.Type_.knearestneighborsclassifier_)->numberofneighbors_;
  if (this == (Int64Parameter *)0x0) {
    this = (Int64Parameter *)operator_new(0x28);
    CoreML::Specification::Int64Parameter::Int64Parameter(this);
    (TVar2.knearestneighborsclassifier_)->numberofneighbors_ = this;
  }
  if (this->_oneof_case_[0] == 0xb) {
    pIVar3 = (this->AllowedValues_).set_;
  }
  else {
    CoreML::Specification::Int64Parameter::clear_AllowedValues(this);
    this->_oneof_case_[0] = 0xb;
    pIVar3 = (Int64Set *)operator_new(0x28);
    CoreML::Specification::Int64Set::Int64Set(pIVar3);
    (this->AllowedValues_).set_ = pIVar3;
  }
  iVar5 = (pIVar3->values_).current_size_;
  if (iVar5 == (pIVar3->values_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar3->values_,iVar5 + 1);
    iVar5 = (pIVar3->values_).current_size_;
  }
  (pIVar3->values_).current_size_ = iVar5 + 1;
  ((pIVar3->values_).rep_)->elements[iVar5] = 1;
  if (this->_oneof_case_[0] == 0xb) {
    pIVar3 = (this->AllowedValues_).set_;
  }
  else {
    CoreML::Specification::Int64Parameter::clear_AllowedValues(this);
    this->_oneof_case_[0] = 0xb;
    pIVar3 = (Int64Set *)operator_new(0x28);
    CoreML::Specification::Int64Set::Int64Set(pIVar3);
    (this->AllowedValues_).set_ = pIVar3;
  }
  iVar5 = (pIVar3->values_).current_size_;
  if (iVar5 == (pIVar3->values_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar3->values_,iVar5 + 1);
    iVar5 = (pIVar3->values_).current_size_;
  }
  (pIVar3->values_).current_size_ = iVar5 + 1;
  ((pIVar3->values_).rep_)->elements[iVar5] = 4;
  if (this->_oneof_case_[0] == 0xb) {
    pIVar3 = (this->AllowedValues_).set_;
  }
  else {
    CoreML::Specification::Int64Parameter::clear_AllowedValues(this);
    this->_oneof_case_[0] = 0xb;
    pIVar3 = (Int64Set *)operator_new(0x28);
    CoreML::Specification::Int64Set::Int64Set(pIVar3);
    (this->AllowedValues_).set_ = pIVar3;
  }
  iVar5 = (pIVar3->values_).current_size_;
  if (iVar5 == (pIVar3->values_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar3->values_,iVar5 + 1);
    iVar5 = (pIVar3->values_).current_size_;
  }
  (pIVar3->values_).current_size_ = iVar5 + 1;
  ((pIVar3->values_).rep_)->elements[iVar5] = 7;
  this->defaultvalue_ = 4;
  if (((TVar2.supportvectorclassifier_)->rho_).total_size_ != 200) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_WeightingScheme
              (TVar2.knearestneighborsclassifier_);
    ((TVar2.supportvectorclassifier_)->rho_).total_size_ = 200;
    this_00 = (UniformWeighting *)operator_new(0x18);
    CoreML::Specification::UniformWeighting::UniformWeighting(this_00);
    ((WeightingSchemeUnion *)((DefaultClassLabelUnion *)&(TVar2.pipeline_)->names_ + 1))->
    uniformweighting_ = this_00;
  }
  this_01 = (TVar2.knearestneighborsclassifier_)->nearestneighborsindex_;
  if (this_01 == (NearestNeighborsIndex *)0x0) {
    this_01 = (NearestNeighborsIndex *)operator_new(0x50);
    CoreML::Specification::NearestNeighborsIndex::NearestNeighborsIndex(this_01);
    (TVar2.knearestneighborsclassifier_)->nearestneighborsindex_ = this_01;
  }
  if (this_01->_oneof_case_[1] != 200) {
    CoreML::Specification::NearestNeighborsIndex::clear_DistanceFunction(this_01);
    this_01->_oneof_case_[1] = 200;
    this_02 = (SquaredEuclideanDistance *)operator_new(0x18);
    CoreML::Specification::SquaredEuclideanDistance::SquaredEuclideanDistance(this_02);
    (this_01->DistanceFunction_).squaredeuclideandistance_ = this_02;
  }
  if (this_01->_oneof_case_[0] == 0x6e) {
    this_03 = (SingleKdTreeIndex *)(this_01->IndexType_).linearindex_;
  }
  else {
    CoreML::Specification::NearestNeighborsIndex::clear_IndexType(this_01);
    this_01->_oneof_case_[0] = 0x6e;
    this_03 = (SingleKdTreeIndex *)operator_new(0x18);
    CoreML::Specification::SingleKdTreeIndex::SingleKdTreeIndex(this_03);
    (this_01->IndexType_).singlekdtreeindex_ = this_03;
  }
  this_03->leafsize_ = 0x1e;
  if ((TVar2.pipeline_)->_cached_size_ != 0x6e) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_DefaultClassLabel
              (TVar2.knearestneighborsclassifier_);
    (TVar2.pipeline_)->_cached_size_ = 0x6e;
    ((DefaultClassLabelUnion *)&(TVar2.pipeline_)->names_)->defaultint64label_ =
         (int64)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Default","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&((DefaultClassLabelUnion *)
              &(TVar2.bayesianprobitregressor_)->regressioninputfeaturename_)->defaultstringlabel_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  CoreML::validate<(MLModelType)404>((Result *)local_78,&local_50);
  bVar1 = CoreML::Result::good((Result *)local_78);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x6d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1ff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return (uint)!bVar1;
}

Assistant:

int testNumberOfNeighborsWithDefaultValueInSet() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    auto *numberOfNeighbors = knnClassifier->mutable_numberofneighbors();
    numberOfNeighbors->mutable_set()->add_values(1);
    numberOfNeighbors->mutable_set()->add_values(4);
    numberOfNeighbors->mutable_set()->add_values(7);
    numberOfNeighbors->set_defaultvalue(4);

    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    knnClassifier->set_defaultstringlabel("Default");

    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);

    return 0;

}